

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::rp_basis(HModel *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  uint *puVar5;
  long in_RDI;
  int var_1;
  int row;
  int var;
  int col;
  uint local_14;
  uint local_c;
  
  printf("\nReporting current basis: numCol = %d; numRow = %d\n",(ulong)*(uint *)(in_RDI + 0x60c),
         (ulong)*(uint *)(in_RDI + 0x610));
  if (0 < *(int *)(in_RDI + 0x60c)) {
    printf("   Var    Col          Flag   Move\n");
  }
  for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x60c); local_c = local_c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)local_c);
    if (*pvVar4 == 0) {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                                  (long)(int)local_c);
      printf("%6d %6d %6d\n",(ulong)local_c,(ulong)local_c,(ulong)*puVar5);
    }
    else {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                                  (long)(int)local_c);
      uVar3 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                                  (long)(int)local_c);
      printf("%6d %6d        %6d %6d\n",(ulong)local_c,(ulong)local_c,(ulong)uVar3,(ulong)*puVar5);
    }
  }
  if (0 < *(int *)(in_RDI + 0x610)) {
    printf("   Var    Row  Basic   Flag   Move\n");
  }
  for (local_14 = 0; (int)local_14 < *(int *)(in_RDI + 0x610); local_14 = local_14 + 1) {
    uVar3 = *(int *)(in_RDI + 0x60c) + local_14;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)uVar3);
    if (*pvVar4 == 0) {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),
                                  (long)(int)local_14);
      uVar1 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                                  (long)(int)uVar3);
      printf("%6d %6d %6d %6d\n",(ulong)uVar3,(ulong)local_14,(ulong)uVar1,(ulong)*puVar5);
    }
    else {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),
                                  (long)(int)local_14);
      uVar1 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                                  (long)(int)uVar3);
      uVar2 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                                  (long)(int)uVar3);
      printf("%6d %6d %6d %6d %6d\n",(ulong)uVar3,(ulong)local_14,(ulong)uVar1,(ulong)uVar2,
             (ulong)*puVar5);
    }
  }
  return;
}

Assistant:

void HModel::rp_basis() {
  printf("\nReporting current basis: numCol = %d; numRow = %d\n", numCol, numRow);
  if (numCol>0) printf("   Var    Col          Flag   Move\n");
  for (int col=0; col < numCol; col++) {
    int var = col;
    if (nonbasicFlag[var])
      printf("%6d %6d        %6d %6d\n", var, col, nonbasicFlag[var], nonbasicMove[var]);
    else
      printf("%6d %6d %6d\n", var, col, nonbasicFlag[var]);
  }
  if (numRow>0) printf("   Var    Row  Basic   Flag   Move\n");
  for (int row=0; row < numRow; row++) {
    int var = numCol+row;
    if (nonbasicFlag[var])
      printf("%6d %6d %6d %6d %6d\n", var, row, basicIndex[row], nonbasicFlag[var], nonbasicMove[var]);
    else
      printf("%6d %6d %6d %6d\n", var, row, basicIndex[row], nonbasicFlag[var]);
  }
}